

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale.c
# Opt level: O2

MV32 av1_scale_mv(MV *mvq4,int x,int y,scale_factors *sf)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  MV32 MVar5;
  
  iVar1 = av1_scaled_x(x * 0x10,sf);
  iVar2 = av1_scaled_y(y * 0x10,sf);
  iVar3 = av1_scaled_y((int)mvq4->row + y * 0x10,sf);
  iVar4 = av1_scaled_x((int)mvq4->col + x * 0x10,sf);
  MVar5.col = iVar4 - iVar1;
  MVar5.row = iVar3 - iVar2;
  return MVar5;
}

Assistant:

MV32 av1_scale_mv(const MV *mvq4, int x, int y,
                  const struct scale_factors *sf) {
  const int x_off_q4 = av1_scaled_x(x << SUBPEL_BITS, sf);
  const int y_off_q4 = av1_scaled_y(y << SUBPEL_BITS, sf);
  const MV32 res = {
    av1_scaled_y((y << SUBPEL_BITS) + mvq4->row, sf) - y_off_q4,
    av1_scaled_x((x << SUBPEL_BITS) + mvq4->col, sf) - x_off_q4
  };
  return res;
}